

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeEntryPointData.cpp
# Opt level: O0

EntryPointPolymorphicInlineCacheInfo * __thiscall
NativeEntryPointData::EnsurePolymorphicInlineCacheInfo
          (NativeEntryPointData *this,Recycler *recycler,FunctionBody *functionBody)

{
  FunctionBody *this_00;
  EntryPointPolymorphicInlineCacheInfo **ppEVar1;
  Recycler *alloc;
  EntryPointPolymorphicInlineCacheInfo *this_01;
  TrackAllocData local_48;
  FunctionBody *local_20;
  FunctionBody *functionBody_local;
  Recycler *recycler_local;
  NativeEntryPointData *this_local;
  
  local_20 = functionBody;
  functionBody_local = (FunctionBody *)recycler;
  recycler_local = (Recycler *)this;
  ppEVar1 = Memory::WriteBarrierPtr::operator_cast_to_EntryPointPolymorphicInlineCacheInfo__
                      ((WriteBarrierPtr *)&this->polymorphicInlineCacheInfo);
  this_00 = functionBody_local;
  if (*ppEVar1 == (EntryPointPolymorphicInlineCacheInfo *)0x0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_48,(type_info *)&Js::EntryPointPolymorphicInlineCacheInfo::typeinfo,0,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeEntryPointData.cpp"
               ,0x7f);
    alloc = Memory::Recycler::TrackAllocInfo((Recycler *)this_00,&local_48);
    this_01 = (EntryPointPolymorphicInlineCacheInfo *)new<Memory::Recycler>(0x38,alloc,0x43c4b0);
    Js::EntryPointPolymorphicInlineCacheInfo::EntryPointPolymorphicInlineCacheInfo(this_01,local_20)
    ;
    Memory::WriteBarrierPtr<Js::EntryPointPolymorphicInlineCacheInfo>::operator=
              (&this->polymorphicInlineCacheInfo,this_01);
  }
  ppEVar1 = Memory::WriteBarrierPtr::operator_cast_to_EntryPointPolymorphicInlineCacheInfo__
                      ((WriteBarrierPtr *)&this->polymorphicInlineCacheInfo);
  return *ppEVar1;
}

Assistant:

EntryPointPolymorphicInlineCacheInfo * 
NativeEntryPointData::EnsurePolymorphicInlineCacheInfo(Recycler * recycler, FunctionBody * functionBody)
{
    if (!polymorphicInlineCacheInfo)
    {
        polymorphicInlineCacheInfo = RecyclerNew(recycler, EntryPointPolymorphicInlineCacheInfo, functionBody);
    }
    return polymorphicInlineCacheInfo;
}